

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O1

node_map * __thiscall
poplar::
compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand(node_map *__return_storage_ptr__,
        compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
        *this)

{
  compact_vector *this_00;
  uint64_t uVar1;
  byte bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *pvVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  uint32_t width;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  compact_vector *this_01;
  ulong uVar12;
  pointer ppVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  node_map *node_map;
  uint64_t new_node_id;
  this_type new_ht;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_358;
  pair<unsigned_long,_unsigned_long> local_338;
  pointer local_328;
  pointer puStack_320;
  pointer puStack_318;
  pointer puStack_310;
  undefined1 local_308 [16];
  pointer local_2f8;
  uint64_t local_2f0;
  node_map *local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_2c8;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_178;
  
  local_2e0 = __return_storage_ptr__;
  compact_bonsai_trie(&local_178,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_,0);
  local_178.size_ = 1;
  bit_vector::bit_vector((bit_vector *)local_308,(this->capa_size_).mask_ + 1);
  *(ulong *)local_308._0_8_ = *(ulong *)local_308._0_8_ | 1;
  uVar9 = (this->table_).width_;
  puStack_318 = (pointer)0x0;
  puStack_310 = (pointer)0x0;
  local_338 = (pair<unsigned_long,_unsigned_long>)ZEXT816(0);
  local_328 = (pointer)0x0;
  puStack_320 = (pointer)0x0;
  width = local_178.capa_size_.bits_ - (uint)uVar9;
  if ((uint)uVar9 <= local_178.capa_size_.bits_ && width != 0) {
    compact_vector::compact_vector((compact_vector *)&local_2c8,(this->capa_size_).mask_ + 1,width);
    puVar10 = local_328;
    uVar5 = local_338.first;
    local_328 = (pointer)local_2c8.hasher_.univ_size_.mask_;
    local_338 = (pair<unsigned_long,_unsigned_long>)local_2c8.hasher_._0_16_;
    local_2c8.hasher_._0_16_ = ZEXT816(0) << 0x20;
    local_2c8.hasher_.univ_size_.mask_ = 0;
    if ((pointer)uVar5 != (pointer)0x0) {
      operator_delete((void *)uVar5,(long)puVar10 - uVar5);
    }
    puStack_310 = local_2c8.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puStack_320 = local_2c8.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    puStack_318 = local_2c8.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if ((pointer)local_2c8.hasher_._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2c8.hasher_._0_8_,
                      local_2c8.hasher_.univ_size_.mask_ - local_2c8.hasher_._0_8_);
    }
  }
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&local_358,0x100);
  this_00 = &this->table_;
  if (1 < (this->table_).size_) {
    local_2d8 = uVar9 & 0xffffffff;
    local_2d0 = ~(-1L << (uVar9 & 0x3f));
    uVar9 = 1;
    do {
      if (((*(ulong *)(local_308._0_8_ + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) == 0) &&
         (bVar7 = compare_dsp_(this,uVar9,0), !bVar7)) {
        uVar8 = uVar9;
        if (local_358.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_358.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_358.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_358.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        do {
          pVar14 = get_parent_and_symb(this,uVar8);
          uVar12 = pVar14.first;
          local_2c8.hasher_.univ_size_._0_8_ = pVar14.second;
          local_2c8.hasher_._0_8_ = uVar8;
          if (local_358.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_358.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&local_358,
                       (iterator)
                       local_358.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (pair<unsigned_long,_unsigned_long> *)&local_2c8);
          }
          else {
            (local_358.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = uVar8;
            (local_358.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = pVar14.second;
            local_358.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_358.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = uVar12;
        } while ((*(ulong *)(local_308._0_8_ + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) == 0);
        puVar10 = (this_00->chunks_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puStack_320 == (pointer)0x0) {
          uVar1 = (this->table_).width_;
          uVar12 = uVar12 * uVar1;
          uVar8 = (ulong)((uint)uVar12 & 0x3f);
          if (uVar1 + uVar8 < 0x41) {
            uVar8 = puVar10[uVar12 >> 6] >> uVar8;
          }
          else {
            bVar2 = (byte)uVar12 & 0x3f;
            uVar8 = puVar10[uVar12 >> 6] >> bVar2 | puVar10[(uVar12 >> 6) + 1] << 0x40 - bVar2;
          }
          uVar8 = uVar8 & (this->table_).mask_;
        }
        else {
          uVar1 = (this->table_).width_;
          uVar8 = uVar1 * uVar12;
          uVar11 = (ulong)((uint)uVar8 & 0x3f);
          if (uVar1 + uVar11 < 0x41) {
            uVar8 = puVar10[uVar8 >> 6] >> uVar11;
          }
          else {
            bVar2 = (byte)uVar8 & 0x3f;
            uVar8 = puVar10[uVar8 >> 6] >> bVar2 | puVar10[(uVar8 >> 6) + 1] << 0x40 - bVar2;
          }
          uVar12 = uVar12 * (long)puStack_310;
          uVar11 = (ulong)((uint)uVar12 & 0x3f);
          if ((long)puStack_310 + uVar11 < 0x41) {
            uVar12 = *(ulong *)(local_338.first + (uVar12 >> 6) * 8) >> uVar11;
          }
          else {
            bVar2 = (byte)uVar12 & 0x3f;
            uVar12 = *(ulong *)(local_338.first + (uVar12 >> 6) * 8) >> bVar2 |
                     *(pointer)(local_338.first + ((uVar12 >> 6) + 1) * 8) << 0x40 - bVar2;
          }
          uVar8 = (uVar12 & (ulong)puStack_318) << (local_2d8 & 0x3f) | uVar8 & (this->table_).mask_
          ;
        }
        local_2c8.hasher_._0_8_ = uVar8;
        ppVar13 = local_358.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        while (ppVar13 !=
               local_358.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
          add_child(&local_178,(uint64_t *)&local_2c8,ppVar13[-1].second);
          ppVar13 = ppVar13 + -1;
          uVar1 = ppVar13->first;
          uVar6 = local_2c8.hasher_._0_8_;
          puVar10 = (pointer)local_2c8.hasher_._0_8_;
          this_01 = this_00;
          if (puStack_320 != (pointer)0x0) {
            compact_vector::set(this_00,uVar1,local_2c8.hasher_._0_8_ & local_2d0);
            puVar10 = (pointer)((ulong)uVar6 >> (local_2d8 & 0x3f));
            this_01 = (compact_vector *)&local_338;
          }
          compact_vector::set(this_01,uVar1,(uint64_t)puVar10);
          *(ulong *)(local_308._0_8_ + (ppVar13->first >> 6) * 8) =
               *(ulong *)(local_308._0_8_ + (ppVar13->first >> 6) * 8) |
               1L << (ppVar13->first & 0x3f);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->table_).size_);
  }
  (local_2e0->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_338.first;
  (local_2e0->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_338.second;
  (local_2e0->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
  local_328 = (pointer)0x0;
  local_338 = (pair<unsigned_long,_unsigned_long>)(ZEXT816(0) << 0x20);
  (local_2e0->map_high_).width_ = (uint64_t)puStack_310;
  (local_2e0->map_high_).size_ = (uint64_t)puStack_320;
  (local_2e0->map_high_).mask_ = (uint64_t)puStack_318;
  puVar10 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (local_2e0->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_2e0->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar10;
  (local_2e0->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_338.first;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_338.second;
  (local_2e0->map_low_).width_ = (this->table_).width_;
  uVar1 = (this->table_).mask_;
  (local_2e0->map_low_).size_ = (this->table_).size_;
  (local_2e0->map_low_).mask_ = uVar1;
  (local_2e0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_308._0_8_;
  (local_2e0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_308._8_8_;
  (local_2e0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2f8;
  local_2f8 = (pointer)0x0;
  (local_2e0->done_flags_).size_ = local_2f0;
  local_2c8.hasher_.univ_size_.mask_ = (this->hasher_).univ_size_.mask_;
  local_2c8.hasher_._0_16_ = *(undefined1 (*) [16])&this->hasher_;
  local_2c8.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2c8.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2c8.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_338.first;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_2c8.table_.width_ = (this->table_).width_;
  local_2c8.table_.size_ = (this->table_).size_;
  local_2c8.table_.mask_ = (this->table_).mask_;
  local_2c8.aux_cht_.hasher_.shift_ = (this->aux_cht_).hasher_.shift_;
  local_2c8.aux_cht_.hasher_._4_4_ = *(undefined4 *)&(this->aux_cht_).hasher_.field_0x4;
  local_2c8.aux_cht_.hasher_.univ_size_.bits_ = (this->aux_cht_).hasher_.univ_size_.bits_;
  local_2c8.aux_cht_.hasher_.univ_size_._4_4_ =
       *(undefined4 *)&(this->aux_cht_).hasher_.univ_size_.field_0x4;
  local_2c8.aux_cht_.hasher_.univ_size_.mask_ = (this->aux_cht_).hasher_.univ_size_.mask_;
  local_2c8.aux_cht_.table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->aux_cht_).table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2c8.aux_cht_.table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->aux_cht_).table_.chunks_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2c8.aux_cht_.table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->aux_cht_).table_.chunks_.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = &(this->aux_cht_).table_.chunks_;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_338.first;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_2c8.aux_cht_.table_.width_ = (this->aux_cht_).table_.width_;
  local_2c8.aux_cht_.table_.size_ = (this->aux_cht_).table_.size_;
  local_2c8.aux_cht_.table_.mask_ = (this->aux_cht_).table_.mask_;
  local_2c8.aux_cht_.size_ = (this->aux_cht_).size_;
  local_2c8.aux_cht_.max_size_ = (this->aux_cht_).max_size_;
  local_2c8.aux_cht_.univ_size_.bits_ = (this->aux_cht_).univ_size_.bits_;
  local_2c8.aux_cht_.univ_size_._4_4_ = *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4;
  local_2c8.aux_cht_.univ_size_.mask_ = (this->aux_cht_).univ_size_.mask_;
  local_2c8.aux_cht_.capa_size_.bits_ = (this->aux_cht_).capa_size_.bits_;
  local_2c8.aux_cht_.capa_size_._4_4_ = *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4;
  local_2c8.aux_cht_.capa_size_.mask_ = (this->aux_cht_).capa_size_.mask_;
  local_2c8.aux_cht_.quo_size_.bits_ = (this->aux_cht_).quo_size_.bits_;
  local_2c8.aux_cht_.quo_size_._4_4_ = *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4;
  local_2c8.aux_cht_.quo_size_.mask_ = (this->aux_cht_).quo_size_.mask_;
  local_2c8.aux_cht_.quo_shift_ = (this->aux_cht_).quo_shift_;
  local_2c8.aux_cht_.quo_invmask_ = (this->aux_cht_).quo_invmask_;
  local_2c8.aux_map_.table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2c8.aux_map_.table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8.aux_map_.table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = &(this->aux_map_).table_;
  (pvVar4->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_338.first;
  (pvVar4->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_2c8.aux_map_.size_ = (this->aux_map_).size_;
  local_2c8.aux_map_.max_size_ = (this->aux_map_).max_size_;
  local_2c8.aux_map_.capa_size_.bits_ = (this->aux_map_).capa_size_.bits_;
  local_2c8.aux_map_.capa_size_._4_4_ = *(undefined4 *)&(this->aux_map_).capa_size_.field_0x4;
  local_2c8.aux_map_.capa_size_.mask_ = (this->aux_map_).capa_size_.mask_;
  local_2c8.size_ = this->size_;
  local_2c8.max_size_ = this->max_size_;
  local_2c8.capa_size_.bits_ = (this->capa_size_).bits_;
  local_2c8.capa_size_._4_4_ = *(undefined4 *)&(this->capa_size_).field_0x4;
  local_2c8.capa_size_.mask_ = (this->capa_size_).mask_;
  local_2c8.symb_size_.bits_ = (this->symb_size_).bits_;
  local_2c8.symb_size_._4_4_ = *(undefined4 *)&(this->symb_size_).field_0x4;
  local_2c8.symb_size_.mask_ = (this->symb_size_).mask_;
  local_308 = (undefined1  [16])local_338;
  operator=(this,&local_178);
  operator=(&local_178,&local_2c8);
  ~compact_bonsai_trie(&local_2c8);
  if (local_358.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_358.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_338.first != (pointer)0x0) {
    operator_delete((void *)local_338.first,(long)local_328 - local_338.first);
  }
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,(long)local_2f8 - local_308._0_8_);
  }
  ~compact_bonsai_trie(&local_178);
  return local_2e0;
}

Assistant:

node_map expand() {
        // this_type new_ht{capa_bits() + 1, symb_size_.bits(), aux_cht_.capa_bits()};
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        size_p2 low_size{table_.width()};
        compact_vector map_high;

        if (low_size.bits() < new_ht.capa_bits()) {
            map_high = compact_vector(capa_size(), new_ht.capa_bits() - low_size.bits());
        }

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        auto get_mapping = [&](uint64_t i) -> uint64_t {
            if (map_high.size() == 0) {
                return table_[i];
            } else {
                return table_[i] | (map_high[i] << low_size.bits());
            }
        };

        auto set_mapping = [&](uint64_t i, uint64_t v) {
            if (map_high.size() == 0) {
                table_.set(i, v);
            } else {
                table_.set(i, v & low_size.mask());
                map_high.set(i, v >> low_size.bits());
            }
        };

        // 0 is root
        for (uint64_t i = 1; i < table_.size(); ++i) {
            if (done_flags[i] or compare_dsp_(i, 0)) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = get_mapping(node_id);

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                set_mapping(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(map_high), std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }